

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtarga.c
# Opt level: O0

void put_pixel_rows(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  long in_RSI;
  long in_RDI;
  JDIMENSION col;
  char *outptr;
  JSAMPROW inptr;
  tga_dest_ptr dest;
  int local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  
  local_28 = (undefined1 *)**(undefined8 **)(in_RSI + 0x28);
  local_30 = *(undefined1 **)(in_RSI + 0x38);
  for (local_34 = *(int *)(in_RDI + 0x88); local_34 != 0; local_34 = local_34 + -1) {
    *local_30 = local_28[2];
    local_30[1] = local_28[1];
    local_30[2] = *local_28;
    local_28 = local_28 + 3;
    local_30 = local_30 + 3;
  }
  fwrite(*(void **)(in_RSI + 0x38),1,(ulong)*(uint *)(in_RSI + 0x40),*(FILE **)(in_RSI + 0x20));
  return;
}

Assistant:

METHODDEF(void)
put_pixel_rows(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
               JDIMENSION rows_supplied)
/* used for unquantized full-color output */
{
  tga_dest_ptr dest = (tga_dest_ptr)dinfo;
  register JSAMPROW inptr;
  register char *outptr;
  register JDIMENSION col;

  inptr = dest->pub.buffer[0];
  outptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    outptr[0] = inptr[2]; /* RGB to BGR order */
    outptr[1] = inptr[1];
    outptr[2] = inptr[0];
    inptr += 3, outptr += 3;
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}